

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O0

word Gia_LutComputeTruth6Map(Gia_Man_t *p,int iPo,Vec_Int_t *vMap)

{
  int iVar1;
  Gia_Obj_t *pObj_00;
  word local_40;
  word Truth;
  Gia_Obj_t *pObj;
  Vec_Int_t *vMap_local;
  int iPo_local;
  Gia_Man_t *p_local;
  
  pObj_00 = Gia_ManPo(p,iPo);
  iVar1 = Gia_ObjFaninId0p(p,pObj_00);
  local_40 = Gia_LutComputeTruth6Map_rec(p,iVar1,vMap);
  iVar1 = Gia_ObjFaninC0(pObj_00);
  if (iVar1 != 0) {
    local_40 = local_40 ^ 0xffffffffffffffff;
  }
  return local_40;
}

Assistant:

word Gia_LutComputeTruth6Map( Gia_Man_t * p, int iPo, Vec_Int_t * vMap )
{
    Gia_Obj_t * pObj = Gia_ManPo( p, iPo );
    word Truth = Gia_LutComputeTruth6Map_rec( p, Gia_ObjFaninId0p(p, pObj), vMap );
    return Gia_ObjFaninC0(pObj) ? ~Truth : Truth;
}